

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MaterialSystem.cpp
# Opt level: O0

aiReturn aiGetMaterialIntegerArray
                   (aiMaterial *pMat,char *pKey,uint type,uint index,int *pOut,uint *pMax)

{
  char *__s;
  bool bVar1;
  uint uVar2;
  uint *puVar3;
  Logger *this;
  allocator<char> local_c9;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_88;
  uint local_64;
  char *pcStack_60;
  uint a_2;
  char *cur;
  uint local_50;
  uint a_1;
  uint a;
  uint local_44;
  aiMaterialProperty *paStack_40;
  uint iWrite;
  aiMaterialProperty *prop;
  uint *pMax_local;
  int *pOut_local;
  uint index_local;
  uint type_local;
  char *pKey_local;
  aiMaterial *pMat_local;
  
  prop = (aiMaterialProperty *)pMax;
  pMax_local = (uint *)pOut;
  pOut_local._0_4_ = index;
  pOut_local._4_4_ = type;
  _index_local = pKey;
  pKey_local = (char *)pMat;
  if (pOut == (int *)0x0) {
    __assert_fail("pOut != __null",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/quantumsheep[P]unicy/libs/assimp/code/Material/MaterialSystem.cpp"
                  ,0xba,
                  "aiReturn aiGetMaterialIntegerArray(const aiMaterial *, const char *, unsigned int, unsigned int, int *, unsigned int *)"
                 );
  }
  if (pMat != (aiMaterial *)0x0) {
    aiGetMaterialProperty(pMat,pKey,type,index,&stack0xffffffffffffffc0);
    if (paStack_40 == (aiMaterialProperty *)0x0) {
      pMat_local._4_4_ = aiReturn_FAILURE;
    }
    else {
      local_44 = 0;
      if ((paStack_40->mType == aiPTI_Integer) || (paStack_40->mType == aiPTI_Buffer)) {
        a = paStack_40->mDataLength >> 2;
        a_1 = 1;
        puVar3 = std::max<unsigned_int>(&a,&a_1);
        local_44 = *puVar3;
        if (prop != (aiMaterialProperty *)0x0) {
          puVar3 = std::min<unsigned_int>((uint *)prop,&local_44);
          local_44 = *puVar3;
        }
        if (paStack_40->mDataLength == 1) {
          *pMax_local = (int)*paStack_40->mData;
        }
        else {
          for (local_50 = 0; local_50 < local_44; local_50 = local_50 + 1) {
            pMax_local[local_50] = *(uint *)(paStack_40->mData + (ulong)local_50 * 4);
          }
        }
        if (prop != (aiMaterialProperty *)0x0) {
          (prop->mKey).length = local_44;
        }
      }
      else if (paStack_40->mType == aiPTI_Float) {
        local_44 = paStack_40->mDataLength >> 2;
        if (prop != (aiMaterialProperty *)0x0) {
          puVar3 = std::min<unsigned_int>((uint *)prop,&local_44);
          local_44 = *puVar3;
        }
        for (cur._4_4_ = 0; cur._4_4_ < local_44; cur._4_4_ = cur._4_4_ + 1) {
          pMax_local[cur._4_4_] = (int)*(float *)(paStack_40->mData + (ulong)cur._4_4_ * 4);
        }
        if (prop != (aiMaterialProperty *)0x0) {
          (prop->mKey).length = local_44;
        }
      }
      else {
        if (prop != (aiMaterialProperty *)0x0) {
          local_44 = (prop->mKey).length;
        }
        pcStack_60 = paStack_40->mData + 4;
        if (paStack_40->mDataLength < 5) {
          __assert_fail("prop->mDataLength >= 5",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/quantumsheep[P]unicy/libs/assimp/code/Material/MaterialSystem.cpp"
                        ,0xeb,
                        "aiReturn aiGetMaterialIntegerArray(const aiMaterial *, const char *, unsigned int, unsigned int, int *, unsigned int *)"
                       );
        }
        if (paStack_40->mData[paStack_40->mDataLength - 1] != '\0') {
          __assert_fail("!prop->mData[ prop->mDataLength - 1 ]",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/quantumsheep[P]unicy/libs/assimp/code/Material/MaterialSystem.cpp"
                        ,0xec,
                        "aiReturn aiGetMaterialIntegerArray(const aiMaterial *, const char *, unsigned int, unsigned int, int *, unsigned int *)"
                       );
        }
        local_64 = 0;
        while( true ) {
          uVar2 = Assimp::strtol10(pcStack_60,&stack0xffffffffffffffa0);
          pMax_local[local_64] = uVar2;
          if (local_64 == local_44 - 1) break;
          bVar1 = Assimp::IsSpace<char>(*pcStack_60);
          if (!bVar1) {
            this = Assimp::DefaultLogger::get();
            __s = _index_local;
            std::allocator<char>::allocator();
            std::__cxx11::string::string<std::allocator<char>>((string *)&local_c8,__s,&local_c9);
            std::operator+(&local_a8,"Material property",&local_c8);
            std::operator+(&local_88,&local_a8,
                           " is a string; failed to parse an integer array out of it.");
            Assimp::Logger::error(this,&local_88);
            std::__cxx11::string::~string((string *)&local_88);
            std::__cxx11::string::~string((string *)&local_a8);
            std::__cxx11::string::~string((string *)&local_c8);
            std::allocator<char>::~allocator(&local_c9);
            return aiReturn_FAILURE;
          }
          local_64 = local_64 + 1;
        }
        if (prop != (aiMaterialProperty *)0x0) {
          (prop->mKey).length = local_44;
        }
      }
      pMat_local._4_4_ = aiReturn_SUCCESS;
    }
    return pMat_local._4_4_;
  }
  __assert_fail("pMat != __null",
                "/workspace/llm4binary/github/license_all_cmakelists_25/quantumsheep[P]unicy/libs/assimp/code/Material/MaterialSystem.cpp"
                ,0xbb,
                "aiReturn aiGetMaterialIntegerArray(const aiMaterial *, const char *, unsigned int, unsigned int, int *, unsigned int *)"
               );
}

Assistant:

aiReturn aiGetMaterialIntegerArray(const aiMaterial* pMat,
    const char* pKey,
    unsigned int type,
    unsigned int index,
    int* pOut,
    unsigned int* pMax)
{
    ai_assert( pOut != NULL );
    ai_assert( pMat != NULL );

    const aiMaterialProperty* prop;
    aiGetMaterialProperty(pMat,pKey,type,index,(const aiMaterialProperty**) &prop);
    if (!prop) {
        return AI_FAILURE;
    }

    // data is given in ints, simply copy it
    unsigned int iWrite = 0;
    if( aiPTI_Integer == prop->mType || aiPTI_Buffer == prop->mType)    {
        iWrite = std::max(static_cast<unsigned int>(prop->mDataLength / sizeof(int32_t)), 1u);
        if (pMax) {
            iWrite = std::min(*pMax,iWrite);
        }
        if (1 == prop->mDataLength) {
            // bool type, 1 byte
            *pOut = static_cast<int>(*prop->mData);
        }
        else {
            for (unsigned int a = 0; a < iWrite;++a) {
                pOut[a] = static_cast<int>(reinterpret_cast<int32_t*>(prop->mData)[a]);
            }
        }
        if (pMax) {
            *pMax = iWrite;
        }
    }
    // data is given in floats convert to int
    else if( aiPTI_Float == prop->mType)    {
        iWrite = prop->mDataLength / sizeof(float);
        if (pMax) {
            iWrite = std::min(*pMax,iWrite); ;
        }
        for (unsigned int a = 0; a < iWrite;++a) {
            pOut[a] = static_cast<int>(reinterpret_cast<float*>(prop->mData)[a]);
        }
        if (pMax) {
            *pMax = iWrite;
        }
    }
    // it is a string ... no way to read something out of this
    else    {
        if (pMax) {
            iWrite = *pMax;
        }
        // strings are zero-terminated with a 32 bit length prefix, so this is safe
        const char *cur =  prop->mData+4;
        ai_assert( prop->mDataLength >= 5 );
        ai_assert( !prop->mData[ prop->mDataLength - 1 ] );
        for (unsigned int a = 0; ;++a) {
            pOut[a] = strtol10(cur,&cur);
            if(a==iWrite-1) {
                break;
            }
            if(!IsSpace(*cur)) {
                ASSIMP_LOG_ERROR("Material property" + std::string(pKey) +
                    " is a string; failed to parse an integer array out of it.");
                return AI_FAILURE;
            }
        }

        if (pMax) {
            *pMax = iWrite;
        }
    }
    return AI_SUCCESS;
}